

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  ssize_t sVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  char status_ch;
  char local_139;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  int local_94;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_139 = 'L';
  if (reason != TEST_DID_NOT_DIE) {
    local_139 = (reason == TEST_THREW_EXCEPTION) * '\x02' + 'R';
  }
  do {
    sVar1 = write(this->write_fd_,&local_139,1);
    if ((int)sVar1 != -1) {
      _exit(1);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_90 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_118 = (ulong *)*plVar3;
  puVar6 = (ulong *)(plVar3 + 2);
  if (local_118 == puVar6) {
    local_108 = *puVar6;
    lStack_100 = plVar3[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar6;
  }
  local_110 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_94 = 0x1e9;
  StreamableToString<int>(&local_f8,&local_94);
  uVar8 = 0xf;
  if (local_118 != &local_108) {
    uVar8 = local_108;
  }
  if (uVar8 < local_f8._M_string_length + local_110) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar9 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_110 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
      goto LAB_00120291;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
LAB_00120291:
  local_138 = (long *)*puVar4;
  plVar3 = puVar4 + 2;
  if (local_138 == plVar3) {
    local_128 = *plVar3;
    uStack_120 = puVar4[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar3;
  }
  local_130 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_b8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b8 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_d8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_d8 == plVar5) {
    local_c8 = *plVar5;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar5;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_70._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  DeathTestAbort(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}